

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrayops.c
# Opt level: O1

LispPTR N_OP_misc3(LispPTR baseL,LispPTR typenumber,LispPTR inx,int alpha)

{
  LispPTR LVar1;
  uint type;
  uint index;
  
  if (alpha != 9) {
    MachineState.tosvalue = inx;
    MachineState.errorexit = 1;
    return 0xffffffff;
  }
  if ((inx & 0xfff0000) == 0xe0000) {
    index = inx & 0xffff;
  }
  else {
    if ((*(ushort *)((ulong)(inx >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
      MachineState.tosvalue = inx;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
    if ((inx & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)inx);
    }
    index = *(uint *)(Lisp_world + inx);
    if ((int)index < 0) {
      MachineState.tosvalue = inx;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
  }
  if ((typenumber & 0xfff0000) != 0xe0000) {
    if ((*(ushort *)((ulong)(typenumber >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) == 2) {
      if ((typenumber & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)typenumber);
      }
      type = *(uint *)(Lisp_world + typenumber);
      if (-1 < (int)type) goto LAB_00108b42;
    }
    MachineState.tosvalue = inx;
    MachineState.errorexit = 1;
    return 0xffffffff;
  }
  type = typenumber & 0xffff;
LAB_00108b42:
  LVar1 = aref_switch(type,inx,baseL,index);
  return LVar1;
}

Assistant:

LispPTR N_OP_misc3(LispPTR baseL, LispPTR typenumber, LispPTR inx, int alpha) {
  int index, type;

  if (alpha != 9) ERROR_EXIT(inx);
  /*  test and setup index  */
  N_GetPos(inx, index, inx);

  /*  test and setup typenumber  */
  N_GetPos(typenumber, type, inx);

  /*  dispatch on type  */
  return (aref_switch((unsigned)type, inx, baseL, index));
}